

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffmkfm(fitsfile *fptr,char *keyname,double *value,int decim,char *comm,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *comm_00;
  char valstring [71];
  char tmpstring [71];
  char oldcomm [73];
  char card [81];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  iVar1 = ffgkey(fptr,keyname,local_178,local_d8,status);
  if (iVar1 < 1) {
    local_178[0] = '(';
    local_178[1] = '\0';
    ffd2f(*value,decim,local_128,status);
    sVar2 = strlen(local_128);
    if (0xffffffffffffffb8 < sVar2 - 0x44) {
      strcat(local_178,local_128);
      sVar2 = strlen(local_178);
      (local_178 + sVar2)[0] = ',';
      (local_178 + sVar2)[1] = ' ';
      local_178[sVar2 + 2] = '\0';
      ffd2f(value[1],decim,local_128,status);
      sVar2 = strlen(local_178);
      sVar3 = strlen(local_128);
      if (0xffffffffffffffb8 < (sVar3 + sVar2) - 0x46) {
        strcat(local_178,local_128);
        sVar2 = strlen(local_178);
        (local_178 + sVar2)[0] = ')';
        (local_178 + sVar2)[1] = '\0';
        comm_00 = local_d8;
        if ((comm != (char *)0x0) && (*comm != '&')) {
          comm_00 = comm;
        }
        ffmkky(keyname,local_178,comm_00,local_88,status);
        ffmkey(fptr,local_88,status);
        goto LAB_00186d47;
      }
    }
    ffpmsg("complex key value too long (ffmkfm)");
    *status = 0x192;
    iVar1 = 0x192;
  }
  else {
LAB_00186d47:
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffmkfm(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           double *value,           /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE], tmpstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    strcpy(valstring, "(" );
    ffd2f(value[0], decim, tmpstring, status); /* convert to string */
    if (strlen(tmpstring)+3 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffmkfm)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ", ");
    ffd2f(value[1], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring) + strlen(tmpstring)+1 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffmkfm)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ")");

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status);

    return(*status);
}